

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

uint * __thiscall
cimg_library::CImg<unsigned_int>::max_min<float>(CImg<unsigned_int> *this,float *min_val)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  bool bVar6;
  CImgInstanceException *this_00;
  char *pcVar7;
  char *pcVar8;
  ulongT uVar9;
  uint val;
  uint *_maxptrs;
  uint *ptrs;
  uint min_value;
  uint max_value;
  uint *ptr_max;
  float *min_val_local;
  CImg<unsigned_int> *this_local;
  
  bVar6 = is_empty(this);
  if (!bVar6) {
    _min_value = this->_data;
    ptrs._0_4_ = *_min_value;
    _maxptrs = this->_data;
    puVar5 = this->_data;
    uVar9 = size(this);
    ptrs._4_4_ = (uint)ptrs;
    for (; _maxptrs < puVar5 + uVar9; _maxptrs = _maxptrs + 1) {
      uVar4 = *_maxptrs;
      if (ptrs._4_4_ < uVar4) {
        _min_value = _maxptrs;
        ptrs._4_4_ = uVar4;
      }
      if (uVar4 < (uint)ptrs) {
        ptrs._0_4_ = uVar4;
      }
    }
    *min_val = (float)(uint)ptrs;
    return _min_value;
  }
  this_00 = (CImgInstanceException *)__cxa_allocate_exception(0x10);
  uVar4 = this->_width;
  uVar1 = this->_height;
  uVar2 = this->_depth;
  uVar3 = this->_spectrum;
  puVar5 = this->_data;
  pcVar7 = "non-";
  if ((this->_is_shared & 1U) != 0) {
    pcVar7 = "";
  }
  pcVar8 = pixel_type();
  CImgInstanceException::CImgInstanceException
            (this_00,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::max_min(): Empty instance.",
             (ulong)uVar4,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,puVar5,pcVar7,pcVar8);
  __cxa_throw(this_00,&CImgInstanceException::typeinfo,CImgInstanceException::~CImgInstanceException
             );
}

Assistant:

const T& max_min(t& min_val) const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "max_min(): Empty instance.",
                                    cimg_instance);
      const T *ptr_max = _data;
      T max_value = *ptr_max, min_value = max_value;
      cimg_for(*this,ptrs,T) {
        const T val = *ptrs;
        if (val>max_value) { max_value = val; ptr_max = ptrs; }
        if (val<min_value) min_value = val;
      }
      min_val = (t)min_value;
      return *ptr_max;
    }